

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall el::base::Writer::processDispatch(Writer *this)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  stringstream_t *psVar4;
  long in_RDI;
  bool in_stack_00000066;
  bool in_stack_00000067;
  string *in_stack_00000068;
  Writer *in_stack_00000070;
  size_t i;
  string_t logMessage;
  bool firstDispatched;
  Writer *in_stack_00000360;
  size_type in_stack_ffffffffffffff08;
  Storage *in_stack_ffffffffffffff10;
  allocator *paVar5;
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [32];
  string local_68 [48];
  ulong local_38;
  string local_30 [39];
  byte local_9;
  
  std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1d5478);
  bVar1 = Storage::hasFlag(in_stack_ffffffffffffff10,
                           (LoggingFlag)(in_stack_ffffffffffffff08 >> 0x30));
  if (bVar1) {
    local_9 = 0;
    std::__cxx11::string::string(local_30);
    local_38 = 0;
    do {
      if ((*(byte *)(in_RDI + 0x38) & 1) == 0) {
        if (*(long *)(in_RDI + 0x30) != 0) {
          psVar4 = Logger::stream_abi_cxx11_(*(Logger **)(in_RDI + 0x30));
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_88,"",&local_89);
          std::__cxx11::stringstream::str((string *)psVar4);
          std::__cxx11::string::~string(local_88);
          std::allocator<char>::~allocator((allocator<char> *)&local_89);
          (**(code **)(**(long **)(in_RDI + 0x30) + 8))();
        }
      }
      else {
        if ((local_9 & 1) == 0) {
          local_9 = 1;
          sVar3 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(in_RDI + 0x58));
          if (1 < sVar3) {
            Logger::stream_abi_cxx11_(*(Logger **)(in_RDI + 0x30));
            std::__cxx11::stringstream::str();
            std::__cxx11::string::operator=(local_30,local_68);
            std::__cxx11::string::~string(local_68);
          }
        }
        else {
          psVar4 = Logger::stream_abi_cxx11_(*(Logger **)(in_RDI + 0x30));
          std::operator<<((ostream *)(psVar4 + 0x10),local_30);
        }
        triggerDispatch(in_stack_00000360);
      }
      uVar2 = local_38 + 1;
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(in_RDI + 0x58));
      if (uVar2 < sVar3) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        initializeLogger(in_stack_00000070,in_stack_00000068,in_stack_00000067,in_stack_00000066);
      }
      uVar2 = local_38 + 1;
      local_38 = uVar2;
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(in_RDI + 0x58));
    } while (uVar2 < sVar3);
    std::__cxx11::string::~string(local_30);
  }
  else if ((*(byte *)(in_RDI + 0x38) & 1) == 0) {
    if (*(long *)(in_RDI + 0x30) != 0) {
      psVar4 = Logger::stream_abi_cxx11_(*(Logger **)(in_RDI + 0x30));
      paVar5 = &local_b1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,"",paVar5);
      std::__cxx11::stringstream::str((string *)psVar4);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      (**(code **)(**(long **)(in_RDI + 0x30) + 8))();
    }
  }
  else {
    triggerDispatch(in_stack_00000360);
  }
  return;
}

Assistant:

void processDispatch() {
#if ELPP_LOGGING_ENABLED
    if (ELPP->hasFlag(LoggingFlag::MultiLoggerSupport)) {
      bool firstDispatched = false;
      base::type::string_t logMessage;
      std::size_t i = 0;
      do {
        if (m_proceed) {
          if (firstDispatched) {
            m_logger->stream() << logMessage;
          } else {
            firstDispatched = true;
            if (m_loggerIds.size() > 1) {
              logMessage = m_logger->stream().str();
            }
          }
          triggerDispatch();
        } else if (m_logger != nullptr) {
          m_logger->stream().str(ELPP_LITERAL(""));
          m_logger->releaseLock();
        }
        if (i + 1 < m_loggerIds.size()) {
          initializeLogger(m_loggerIds.at(i + 1));
        }
      } while (++i < m_loggerIds.size());
    } else {
      if (m_proceed) {
        triggerDispatch();
      } else if (m_logger != nullptr) {
        m_logger->stream().str(ELPP_LITERAL(""));
        m_logger->releaseLock();
      }
    }
#else
    if (m_logger != nullptr) {
      m_logger->stream().str(ELPP_LITERAL(""));
      m_logger->releaseLock();
    }
#endif // ELPP_LOGGING_ENABLED
  }